

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

void __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::set
          (MutableCodePointTrie *this,UChar32 c,uint32_t value,UErrorCode *errorCode)

{
  UBool UVar1;
  bool bVar2;
  int32_t iVar3;
  int32_t block;
  UErrorCode *errorCode_local;
  uint32_t value_local;
  UChar32 c_local;
  MutableCodePointTrie *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if ((uint)c < 0x110000) {
      bVar2 = ensureHighStart(this,c);
      if ((bVar2) && (iVar3 = getDataBlock(this,c >> 4), -1 < iVar3)) {
        this->data[(int)(iVar3 + (c & 0xfU))] = value;
      }
      else {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    else {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return;
}

Assistant:

void MutableCodePointTrie::set(UChar32 c, uint32_t value, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return;
    }
    if ((uint32_t)c > MAX_UNICODE) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    int32_t block;
    if (!ensureHighStart(c) || (block = getDataBlock(c >> UCPTRIE_SHIFT_3)) < 0) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    data[block + (c & UCPTRIE_SMALL_DATA_MASK)] = value;
}